

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s32be
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint64 mVar3;
  long lVar4;
  
  mVar3 = ma_dr_wav_read_pcm_frames_s32(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (ma_int32 *)0x0) {
    uVar1 = pWav->channels;
    for (lVar4 = 0; mVar3 * uVar1 - lVar4 != 0; lVar4 = lVar4 + 1) {
      uVar2 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32be(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}